

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestCoverageHandler.cxx
# Opt level: O0

void __thiscall
cmCTestCoverageHandlerLocale::cmCTestCoverageHandlerLocale(cmCTestCoverageHandlerLocale *this)

{
  bool bVar1;
  allocator<char> local_61;
  string local_60;
  undefined1 local_30 [8];
  string l;
  cmCTestCoverageHandlerLocale *this_local;
  
  l.field_2._8_8_ = this;
  std::__cxx11::string::string((string *)this);
  std::__cxx11::string::string((string *)local_30);
  bVar1 = cmsys::SystemTools::GetEnv("LC_ALL",(string *)local_30);
  if (bVar1) {
    std::__cxx11::string::operator=((string *)this,(string *)local_30);
  }
  bVar1 = std::operator!=(&this->lc_all,"C");
  if (bVar1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_60,"LC_ALL=C",&local_61);
    cmsys::SystemTools::PutEnv(&local_60);
    std::__cxx11::string::~string((string *)&local_60);
    std::allocator<char>::~allocator(&local_61);
  }
  std::__cxx11::string::~string((string *)local_30);
  return;
}

Assistant:

cmCTestCoverageHandlerLocale()
  {
    std::string l;
    if (cmSystemTools::GetEnv("LC_ALL", l)) {
      lc_all = l;
    }
    if (lc_all != "C") {
      cmSystemTools::PutEnv("LC_ALL=C");
    }
  }